

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.cpp
# Opt level: O3

int modrf_pos(int ord,double *coef,double a,double b,double *val,int invert)

{
  uint uVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined4 local_98;
  undefined4 local_88;
  undefined4 local_58;
  undefined4 local_48;
  
  pdVar5 = coef + ord;
  auVar11._8_8_ = b;
  auVar11._0_8_ = a;
  auVar11 = divpd(_DAT_00594430,auVar11);
  uVar1 = (uint)(invert == 0);
  auVar14._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
  auVar14._8_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  auVar14._12_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  auVar7._0_8_ = (ulong)b & auVar14._0_8_;
  auVar7._8_8_ = (ulong)a & auVar14._8_8_;
  auVar15._0_8_ = ~auVar14._0_8_ & (ulong)auVar11._0_8_;
  dVar12 = auVar11._8_8_;
  auVar15._8_8_ = ~auVar14._8_8_ & (ulong)dVar12;
  auVar16 = auVar15 | auVar7;
  dVar8 = auVar16._8_8_;
  if (invert == 0) {
    dVar17 = *pdVar5;
    dVar18 = dVar17;
    pdVar3 = pdVar5;
    while (pdVar3 = pdVar3 + -1, coef <= pdVar3) {
      dVar17 = dVar17 * auVar16._0_8_ + *pdVar3;
      dVar18 = dVar18 * dVar8 + *pdVar3;
    }
  }
  else {
    dVar17 = *coef;
    dVar18 = dVar17;
    if (0 < ord) {
      pdVar3 = coef + 1;
      do {
        dVar17 = dVar17 * auVar16._0_8_ + *pdVar3;
        dVar18 = dVar18 * dVar8 + *pdVar3;
        pdVar3 = pdVar3 + 1;
      } while (pdVar3 <= pdVar5);
    }
  }
  iVar2 = 0;
  if (dVar18 * dVar17 <= 0.0) {
    if ((ABS(dVar18) < 1e-12) || (a = b, dVar12 = auVar11._0_8_, ABS(dVar17) < 1e-12)) {
LAB_00591cb4:
      if (invert != 0) {
        a = 1.0 / dVar12;
      }
      *val = a;
      iVar2 = 1;
    }
    else {
      pdVar3 = coef + 1;
      pdVar6 = pdVar5 + -1;
      iVar2 = 0;
      dVar9 = dVar18;
      dVar19 = dVar18;
      do {
        a = (dVar17 * dVar8 - auVar16._0_8_ * dVar19) / (dVar17 - dVar19);
        if (invert == 0) {
          dVar20 = *pdVar5;
          for (pdVar4 = pdVar6; coef <= pdVar4; pdVar4 = pdVar4 + -1) {
            dVar20 = dVar20 * a + *pdVar4;
          }
        }
        else {
          dVar20 = *coef;
          pdVar4 = pdVar3;
          if (0 < ord) {
            do {
              dVar20 = dVar20 * a + *pdVar4;
              pdVar4 = pdVar4 + 1;
            } while (pdVar4 <= pdVar5);
          }
        }
        dVar12 = a;
        if (((1e-12 < ABS(a)) && (ABS(dVar20 / a) < 1e-12)) || (ABS(dVar20) < 1e-12))
        goto LAB_00591cb4;
        if (0.0 <= dVar19 * dVar20) {
          dVar19 = dVar20;
          if (0.0 < dVar9 * dVar20) {
            dVar17 = dVar17 * 0.5;
          }
        }
        else {
          if (0.0 < dVar9 * dVar20) {
            dVar19 = dVar19 * 0.5;
          }
          auVar16._8_8_ = dVar18;
          auVar16._0_8_ = a;
          dVar18 = 0.0;
          dVar17 = dVar20;
          a = dVar8;
        }
        dVar13 = auVar16._0_8_;
        dVar10 = dVar13 - a;
        dVar12 = a;
        if (ABS(dVar10) < ABS(a * 1e-12)) goto LAB_00591cb4;
        iVar2 = iVar2 + 1;
        dVar9 = dVar20;
        dVar8 = a;
      } while (iVar2 != 800);
      fprintf(_stderr,"modrf overflow on interval %f %f\n",SUB84(a,0),dVar13);
      local_58 = SUB84(dVar10,0);
      fprintf(_stderr,"\t b-a = %12.5e\n",local_58);
      local_48 = SUB84(dVar19,0);
      fprintf(_stderr,"\t fa  = %12.5e\n",local_48);
      local_88 = SUB84(dVar17,0);
      fprintf(_stderr,"\t fb  = %12.5e\n",local_88);
      local_98 = SUB84(dVar20,0);
      fprintf(_stderr,"\t fx  = %12.5e\n",local_98);
      if (invert == 0) {
        dVar8 = *pdVar5;
        dVar12 = dVar8;
        for (; coef <= pdVar6; pdVar6 = pdVar6 + -1) {
          dVar12 = dVar12 * a + *pdVar6;
          dVar8 = dVar8 * dVar13 + *pdVar6;
        }
      }
      else {
        dVar8 = *coef;
        dVar12 = dVar8;
        if (0 < ord) {
          do {
            dVar12 = dVar12 * a + *pdVar3;
            dVar8 = dVar8 * dVar13 + *pdVar3;
            pdVar3 = pdVar3 + 1;
          } while (pdVar3 <= pdVar5);
        }
      }
      fprintf(_stderr,"\t true fa = %12.5e\n");
      fprintf(_stderr,"\t true fb = %12.5e\n",SUB84(dVar8,0));
      fprintf(_stderr,"\t gradient= %12.5e\n",SUB84((dVar8 - dVar12) / dVar10,0));
      fwrite("Polynomial coefficients\n",0x18,1,_stderr);
      iVar2 = 0;
      if (-1 < ord) {
        do {
          fprintf(_stderr,"\t%12.5e\n",SUB84(*pdVar5,0));
          pdVar5 = pdVar5 + -1;
        } while (coef <= pdVar5);
      }
    }
  }
  return iVar2;
}

Assistant:

int modrf_pos( int ord, double *coef, double a, double b, 
	double *val, int invert)
   {
   int  its;
   double fx, lfx;
   double *fp;
   double *scoef = coef;
   double *ecoef = &coef[ord];
   double fa, fb;

   // Invert the interval if required
   if (invert)
      {
      double temp = a;
      a = 1.0 / b;
      b = 1.0 / temp;
      }

   // Evaluate the polynomial at the end points
   if (invert)
      {
      fb = fa = *scoef;
      for (fp = scoef + 1; fp <= ecoef; fp++) 
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }
   else
      {
      fb = fa = *ecoef;
      for (fp = ecoef - 1; fp >= scoef; fp--) 
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }

   // if there is no sign difference the method won't work
   if (fa * fb > 0.0)
      return(0);

   // Return if the values are close to zero already
   if (fabs(fa) < RELERROR) 
      {
      *val = invert ? 1.0/a : a;
      return(1);
      }

   if (fabs(fb) < RELERROR) 
      {
      *val = invert ? 1.0/b : b;
      return(1);
      }

   lfx = fa;

   for (its = 0; its < MAXIT; its++) 
      {
      // Assuming straight line from a to b, find zero
      double x = (fb * a - fa * b) / (fb - fa);

      // Evaluate the polynomial at x
      if (invert)
         {
         fx = *scoef;
         for (fp = scoef + 1; fp <= ecoef; fp++)
            fx = x * fx + *fp;
	 }
      else
         {
         fx = *ecoef;
         for (fp = ecoef - 1; fp >= scoef; fp--)
            fx = x * fx + *fp;
         }

      // Evaluate two stopping conditions
      if (fabs(x) > RELERROR && fabs(fx/x) < RELERROR) 
         {
         *val = invert ? 1.0/x : x;
         return(1);
         }
      else if (fabs(fx) < RELERROR) 
         {
         *val = invert ? 1.0/x : x;
         return(1);
         }

      // Subdivide region, depending on whether fx has same sign as fa or fb
      if ((fa * fx) < 0) 
         {
         b = x;
         fb = fx;
         if ((lfx * fx) > 0)
            fa /= 2;
         } 
      else 
         {
         a = x;
         fa = fx;
         if ((lfx * fx) > 0)
            fb /= 2;
         }

   
      // Return if the difference between a and b is very small
      if (fabs(b-a) < fabs(RELERROR * a))
         {
         *val = invert ? 1.0/a : a;
         return(1);
         }

      lfx = fx;
      }

   //==================================================================
   // This is debugging in case something goes wrong.
   // If we reach here, we have not converged -- give some diagnostics
   //==================================================================

   fprintf(stderr, "modrf overflow on interval %f %f\n", a, b);
   fprintf(stderr, "\t b-a = %12.5e\n", b-a);
   fprintf(stderr, "\t fa  = %12.5e\n", fa);
   fprintf(stderr, "\t fb  = %12.5e\n", fb);
   fprintf(stderr, "\t fx  = %12.5e\n", fx);

   // Evaluate the true values at a and b
   if (invert)
      {
      fb = fa = *scoef;
      for (fp = scoef + 1; fp <= ecoef; fp++)
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }
   else
      {
      fb = fa = *ecoef;
      for (fp = ecoef - 1; fp >= scoef; fp--) 
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }

   fprintf(stderr, "\t true fa = %12.5e\n", fa);
   fprintf(stderr, "\t true fb = %12.5e\n", fb);
   fprintf(stderr, "\t gradient= %12.5e\n", (fb-fa)/(b-a));

   // Print out the polynomial
   fprintf(stderr, "Polynomial coefficients\n");
   for (fp = ecoef; fp >= scoef; fp--) 
      fprintf (stderr, "\t%12.5e\n", *fp);

   return(0);
   }